

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HeartGenerator.h
# Opt level: O0

void __thiscall
soul::HEARTGenerator::addBranchIf
          (HEARTGenerator *this,Expression *condition,Block *trueBranch,Block *falseBranch,
          pool_ptr<soul::heart::Block> *subsequentBranch)

{
  Expression *condition_00;
  pool_ptr<soul::heart::Block> local_60 [3];
  Type local_48;
  pool_ptr<soul::heart::Block> *local_30;
  pool_ptr<soul::heart::Block> *subsequentBranch_local;
  Block *falseBranch_local;
  Block *trueBranch_local;
  Expression *condition_local;
  HEARTGenerator *this_local;
  
  local_30 = subsequentBranch;
  subsequentBranch_local = (pool_ptr<soul::heart::Block> *)falseBranch;
  falseBranch_local = trueBranch;
  trueBranch_local = (Block *)condition;
  condition_local = (Expression *)this;
  Type::Type(&local_48,bool_);
  condition_00 = evaluateAsExpression(this,condition,&local_48);
  local_60[0] = (pool_ptr<soul::heart::Block>)subsequentBranch->object;
  FunctionBuilder::addBranchIf
            (&this->builder,condition_00,falseBranch_local,(Block *)subsequentBranch_local,local_60)
  ;
  pool_ptr<soul::heart::Block>::~pool_ptr(local_60);
  Type::~Type(&local_48);
  return;
}

Assistant:

void addBranchIf (AST::Expression& condition, heart::Block& trueBranch,
                      heart::Block& falseBranch, pool_ptr<heart::Block> subsequentBranch)
    {
        builder.addBranchIf (evaluateAsExpression (condition, PrimitiveType::bool_),
                             trueBranch, falseBranch, subsequentBranch);
    }